

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O2

void Cnf_DataLiftGia(Cnf_Dat_t *p,Gia_Man_t *pGia,int nVarsPlus)

{
  int *piVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  long lVar3;
  int v;
  
  for (v = 0; v < pGia->nObjs; v = v + 1) {
    pObj = Gia_ManObj(pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    piVar1 = p->pVarNums;
    iVar2 = Gia_ObjId(pGia,pObj);
    if (-1 < piVar1[iVar2]) {
      piVar1 = p->pVarNums;
      iVar2 = Gia_ObjId(pGia,pObj);
      piVar1[iVar2] = piVar1[iVar2] + nVarsPlus;
    }
  }
  for (lVar3 = 0; lVar3 < p->nLiterals; lVar3 = lVar3 + 1) {
    (*p->pClauses)[lVar3] = (*p->pClauses)[lVar3] + nVarsPlus * 2;
  }
  return;
}

Assistant:

static inline void Cnf_DataLiftGia( Cnf_Dat_t * p, Gia_Man_t * pGia, int nVarsPlus )
{
    Gia_Obj_t * pObj;
    int v;
    Gia_ManForEachObj( pGia, pObj, v )
        if ( p->pVarNums[Gia_ObjId(pGia, pObj)] >= 0 )
            p->pVarNums[Gia_ObjId(pGia, pObj)] += nVarsPlus;
    for ( v = 0; v < p->nLiterals; v++ )
        p->pClauses[0][v] += 2*nVarsPlus;
}